

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlschemas(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  xmlDocPtr pxVar6;
  undefined8 uVar7;
  size_t sVar8;
  xmlDocPtr pxVar9;
  ulong uVar10;
  int nr;
  int nr_00;
  int nr_01;
  bool bVar11;
  int test_ret_3;
  int iVar12;
  char *__s;
  xmlDocPtr in_RSI;
  int *piVar13;
  int test_ret;
  uint no;
  int test_ret_1;
  undefined8 *puVar14;
  ulong uVar15;
  int n_buffer;
  uint uVar16;
  undefined4 uVar17;
  ulong uVar18;
  int local_54;
  int local_50;
  int test_ret_4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int test_ret_2;
  
  if (quiet == '\0') {
    puts("Testing xmlschemas : 16 of 27 functions ...");
  }
  local_54 = 0;
  for (iVar12 = 0; iVar12 != 2; iVar12 = iVar12 + 1) {
    bVar11 = true;
    while (bVar11) {
      iVar1 = xmlMemBlocks();
      __stream = (FILE *)gen_FILE_ptr(iVar12,(int)in_RSI);
      in_RSI = (xmlDocPtr)0x0;
      xmlSchemaDump();
      call_tests = call_tests + 1;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar11 = false;
      printf("Leak of %d blocks found in xmlSchemaDump",(ulong)(uint)(iVar2 - iVar1));
      local_54 = local_54 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  bVar11 = true;
  while (bVar11) {
    bVar11 = true;
    while (bVar11) {
      bVar11 = true;
LAB_001418c1:
      if (bVar11) {
        bVar11 = true;
        while (bVar11) {
          iVar1 = xmlMemBlocks();
          bVar11 = false;
          in_RSI = (xmlDocPtr)0x0;
          xmlSchemaGetParserErrors(0,0,0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 == iVar2) goto LAB_001418c1;
          xmlMemBlocks();
          bVar11 = false;
          printf("Leak of %d blocks found in xmlSchemaGetParserErrors");
          iVar12 = iVar12 + 1;
          printf(" %d");
          printf(" %d");
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        bVar11 = false;
        goto LAB_001418c1;
      }
      bVar11 = false;
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar11 = true;
  while (bVar11) {
    bVar11 = true;
    while (bVar11) {
      bVar11 = true;
LAB_0014199a:
      if (bVar11) {
        bVar11 = true;
        while (bVar11) {
          iVar2 = xmlMemBlocks();
          bVar11 = false;
          in_RSI = (xmlDocPtr)0x0;
          xmlSchemaGetValidErrors(0,0,0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar2 == iVar3) goto LAB_0014199a;
          xmlMemBlocks();
          bVar11 = false;
          printf("Leak of %d blocks found in xmlSchemaGetValidErrors");
          iVar1 = iVar1 + 1;
          printf(" %d");
          printf(" %d");
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        bVar11 = false;
        goto LAB_0014199a;
      }
      bVar11 = false;
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  local_54 = -(local_54 + iVar12 + iVar1);
  bVar11 = true;
  while (bVar11) {
    iVar12 = xmlMemBlocks();
    xmlSchemaIsValid(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar12 == iVar1) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlSchemaIsValid");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_54 = local_54 + -1;
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    iVar1 = xmlMemBlocks();
    pxVar6 = gen_xmlDocPtr(uVar16,(int)in_RSI);
    uVar7 = xmlSchemaNewDocParserCtxt(pxVar6);
    xmlSchemaFreeParserCtxt(uVar7);
    call_tests = call_tests + 1;
    des_xmlDocPtr((int)pxVar6,in_RSI,nr);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaNewDocParserCtxt",(ulong)(uint)(iVar2 - iVar1));
      iVar12 = iVar12 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    for (no = 0; no != 4; no = no + 1) {
      iVar1 = xmlMemBlocks();
      if (uVar16 == 0) {
        bVar11 = false;
        __s = "foo";
      }
      else if (uVar16 == 2) {
        bVar11 = false;
        __s = "test/ent2";
      }
      else if (uVar16 == 1) {
        bVar11 = false;
        __s = "<foo/>";
      }
      else {
        bVar11 = true;
        __s = (char *)0x0;
      }
      uVar4 = gen_int(no,(int)in_RSI);
      if ((bVar11) || (sVar8 = strlen(__s), (int)uVar4 <= (int)sVar8 + 1)) {
        in_RSI = (xmlDocPtr)(ulong)uVar4;
        xmlSchemaNewMemParserCtxt(__s);
        xmlSchemaFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaNewMemParserCtxt",(ulong)(uint)(iVar2 - iVar1)
                );
          local_50 = local_50 + 1;
          printf(" %d",(ulong)uVar16);
          in_RSI = (xmlDocPtr)(ulong)no;
          printf(" %d");
          putchar(10);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  puVar14 = &DAT_00167d78;
  iVar1 = 0;
  pxVar6 = (xmlDocPtr)0x0;
  while (uVar16 = (uint)pxVar6, uVar16 != 4) {
    iVar2 = xmlMemBlocks();
    if (uVar16 < 3) {
      uVar7 = *puVar14;
    }
    else {
      uVar7 = 0;
    }
    xmlSchemaNewParserCtxt(uVar7);
    xmlSchemaFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaNewParserCtxt",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar6;
    }
    puVar14 = puVar14 + 1;
    pxVar6 = (xmlDocPtr)(ulong)(uVar16 + 1);
  }
  function_tests = function_tests + 1;
  local_54 = local_54 - (iVar12 + local_50 + iVar1);
  bVar11 = true;
  while (bVar11) {
    iVar12 = xmlMemBlocks();
    xmlSchemaSAXUnplug(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar12 == iVar1) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlSchemaSAXUnplug");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_54 = local_54 + -1;
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  iVar12 = 0;
  while (bVar11) {
    pxVar6 = (xmlDocPtr)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar6;
      if (iVar2 == 4) break;
      iVar3 = xmlMemBlocks();
      uVar16 = gen_int(iVar2,iVar1);
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      xmlSchemaSetValidOptions();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaSetValidOptions",(ulong)(uint)(iVar1 - iVar3));
        iVar12 = iVar12 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar6;
      }
      pxVar6 = (xmlDocPtr)(ulong)(iVar2 + 1);
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  local_54 = local_54 - iVar12;
  bVar11 = true;
  while (bVar11) {
    iVar12 = xmlMemBlocks();
    xmlSchemaValidCtxtGetOptions(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar12 == iVar1) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlSchemaValidCtxtGetOptions");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_54 = local_54 + -1;
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  while (bVar11) {
    iVar12 = xmlMemBlocks();
    uVar7 = xmlSchemaValidCtxtGetParserCtxt(0);
    xmlFreeParserCtxt(uVar7);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar12 == iVar1) break;
    xmlMemBlocks();
    bVar11 = false;
    printf("Leak of %d blocks found in xmlSchemaValidCtxtGetParserCtxt");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_54 = local_54 + -1;
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  local_44 = 0;
  while (bVar11) {
    pxVar6 = (xmlDocPtr)0x0;
    while( true ) {
      iVar12 = (int)in_RSI;
      iVar1 = (int)pxVar6;
      if (iVar1 == 4) break;
      iVar2 = xmlMemBlocks();
      pxVar9 = gen_xmlDocPtr(iVar1,iVar12);
      in_RSI = pxVar9;
      xmlSchemaValidateDoc(0);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar9,in_RSI,nr_00);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar2 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidateDoc",(ulong)(uint)(iVar12 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar6;
      }
      pxVar6 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  pxVar6 = (xmlDocPtr)0x1;
  local_40 = 0;
  while (pxVar6 != (xmlDocPtr)0x0) {
    for (uVar16 = 0; pxVar6 = (xmlDocPtr)0x0, uVar16 != 8; uVar16 = uVar16 + 1) {
      while( true ) {
        iVar12 = (int)in_RSI;
        iVar1 = (int)pxVar6;
        if (iVar1 == 4) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_filepath(uVar16,iVar12);
        iVar12 = gen_int(iVar1,iVar12);
        xmlSchemaValidateFile(0,in_RSI,iVar12);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar2 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateFile",(ulong)(uint)(iVar12 - iVar2));
          local_40 = local_40 + 1;
          printf(" %d",0);
          printf(" %d",(ulong)uVar16);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar6;
        }
        pxVar6 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  local_48 = 0;
  while (bVar11) {
    pxVar6 = (xmlDocPtr)0x0;
    while( true ) {
      iVar12 = (int)in_RSI;
      iVar1 = (int)pxVar6;
      if (iVar1 == 3) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar1,iVar12);
      xmlSchemaValidateOneElement(0,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar1,(xmlNodePtr)in_RSI,nr_01);
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar2 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidateOneElement",
               (ulong)(uint)(iVar12 - iVar2));
        local_48 = local_48 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar6;
      }
      pxVar6 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  bVar11 = true;
  test_ret_4 = 0;
  while (bVar11) {
    pxVar6 = (xmlDocPtr)0x0;
    while( true ) {
      iVar12 = (int)in_RSI;
      iVar1 = (int)pxVar6;
      if (iVar1 == 8) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_filepath(iVar1,iVar12);
      xmlSchemaValidateSetFilename(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar2 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidateSetFilename",
               (ulong)(uint)(iVar12 - iVar2));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar6;
      }
      pxVar6 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    bVar11 = false;
  }
  function_tests = function_tests + 1;
  uVar10 = 1;
  local_3c = 0;
  while (uVar10 != 0) {
    uVar18 = 0;
    while( true ) {
      uVar10 = 0;
      iVar12 = (int)uVar18;
      if (iVar12 == 8) break;
      while (uVar16 = (uint)uVar10, uVar16 != 4) {
        uVar15 = 0;
        while (iVar1 = (int)uVar15, iVar1 != 2) {
          pxVar6 = (xmlDocPtr)0x0;
          while( true ) {
            iVar3 = (int)in_RSI;
            iVar2 = (int)pxVar6;
            if (iVar2 == 3) break;
            iVar5 = xmlMemBlocks();
            pxVar9 = (xmlDocPtr)gen_xmlParserInputBufferPtr(iVar12,iVar3);
            uVar17 = 0xffffffff;
            if (uVar16 < 3) {
              uVar17 = (&DAT_001540b0)[uVar10];
            }
            if (iVar1 == 0) {
              uVar7 = __xmlDefaultSAXHandler();
            }
            else {
              uVar7 = 0;
            }
            piVar13 = &call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                piVar13 = (int *)0xffffffffffffffff;
              }
              else {
                piVar13 = (int *)0x0;
              }
            }
            in_RSI = pxVar9;
            xmlSchemaValidateStream(0,pxVar9,uVar17,uVar7,piVar13);
            call_tests = call_tests + 1;
            xmlFreeParserInputBuffer(pxVar9);
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar5 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSchemaValidateStream",
                     (ulong)(uint)(iVar3 - iVar5));
              local_3c = local_3c + 1;
              printf(" %d",0);
              printf(" %d",uVar18);
              printf(" %d",uVar10);
              printf(" %d",uVar15);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar6;
            }
            pxVar6 = (xmlDocPtr)(ulong)(iVar2 + 1);
          }
          uVar15 = (ulong)(iVar1 + 1);
        }
        uVar10 = (ulong)(uVar16 + 1);
      }
      uVar18 = (ulong)(iVar12 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_3c = local_48 + test_ret_4 + local_44 + local_40 + local_3c;
  uVar16 = -(local_54 - local_3c);
  if (local_54 != local_3c) {
    printf("Module xmlschemas: %d errors\n",(ulong)uVar16);
  }
  return uVar16;
}

Assistant:

static int
test_xmlschemas(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemas : 16 of 27 functions ...\n");
    test_ret += test_xmlSchemaDump();
    test_ret += test_xmlSchemaGetParserErrors();
    test_ret += test_xmlSchemaGetValidErrors();
    test_ret += test_xmlSchemaIsValid();
    test_ret += test_xmlSchemaNewDocParserCtxt();
    test_ret += test_xmlSchemaNewMemParserCtxt();
    test_ret += test_xmlSchemaNewParserCtxt();
    test_ret += test_xmlSchemaNewValidCtxt();
    test_ret += test_xmlSchemaParse();
    test_ret += test_xmlSchemaSAXPlug();
    test_ret += test_xmlSchemaSAXUnplug();
    test_ret += test_xmlSchemaSetParserErrors();
    test_ret += test_xmlSchemaSetParserStructuredErrors();
    test_ret += test_xmlSchemaSetValidErrors();
    test_ret += test_xmlSchemaSetValidOptions();
    test_ret += test_xmlSchemaSetValidStructuredErrors();
    test_ret += test_xmlSchemaValidCtxtGetOptions();
    test_ret += test_xmlSchemaValidCtxtGetParserCtxt();
    test_ret += test_xmlSchemaValidateDoc();
    test_ret += test_xmlSchemaValidateFile();
    test_ret += test_xmlSchemaValidateOneElement();
    test_ret += test_xmlSchemaValidateSetFilename();
    test_ret += test_xmlSchemaValidateSetLocator();
    test_ret += test_xmlSchemaValidateStream();

    if (test_ret != 0)
	printf("Module xmlschemas: %d errors\n", test_ret);
    return(test_ret);
}